

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O0

char base64char(uchar val)

{
  undefined1 local_a;
  char result;
  uchar val_local;
  
  if (val < 0x1a) {
    local_a = val + 'A';
  }
  else if (val < 0x34) {
    local_a = val + 'G';
  }
  else if (val < 0x3e) {
    local_a = val + 0xfc;
  }
  else if (val == '>') {
    local_a = '+';
  }
  else {
    local_a = '/';
  }
  return local_a;
}

Assistant:

static char base64char(unsigned char val)
{
    char result;

    if (val < 26)
    {
        result = 'A' + (char)val;
    }
    else if (val < 52)
    {
        result = 'a' + ((char)val - 26);
    }
    else if (val < 62)
    {
        result = '0' + ((char)val - 52);
    }
    else if (val == 62)
    {
        result = '+';
    }
    else
    {
        result = '/';
    }

    return result;
}